

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

void evmap_signal_active_(event_base *base,int sig,int ncalls)

{
  undefined8 *puVar1;
  event *local_30;
  event *ev;
  evmap_signal *ctx;
  event_signal_map *map;
  int ncalls_local;
  int sig_local;
  event_base *base_local;
  
  if (((-1 < sig) && (sig < (base->sigmap).nentries)) &&
     (puVar1 = (undefined8 *)(base->sigmap).entries[sig], puVar1 != (undefined8 *)0x0)) {
    for (local_30 = (event *)*puVar1; local_30 != (event *)0x0;
        local_30 = (local_30->ev_).ev_io.ev_io_next.le_next) {
      event_active_nolock_(local_30,8,(short)ncalls);
    }
  }
  return;
}

Assistant:

void
evmap_signal_active_(struct event_base *base, evutil_socket_t sig, int ncalls)
{
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx;
	struct event *ev;

	if (sig < 0 || sig >= map->nentries)
		return;
	GET_SIGNAL_SLOT(ctx, map, sig, evmap_signal);

	if (!ctx)
		return;
	LIST_FOREACH(ev, &ctx->events, ev_signal_next)
		event_active_nolock_(ev, EV_SIGNAL, ncalls);
}